

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O3

int __thiscall
sc_core::sc_phash_base::remove_by_contents
          (sc_phash_base *this,_func_bool_void_ptr_void_ptr *predicate,void *arg)

{
  bool bVar1;
  int iVar2;
  sc_phash_elem *psVar3;
  long lVar4;
  int iVar5;
  sc_phash_elem *p;
  sc_phash_elem **ppsVar6;
  
  iVar2 = this->num_bins;
  if (iVar2 < 1) {
    iVar5 = 0;
  }
  else {
    lVar4 = 0;
    iVar5 = 0;
    do {
      p = this->bins[lVar4];
      if (p != (sc_phash_elem *)0x0) {
        ppsVar6 = this->bins + lVar4;
        do {
          bVar1 = (*predicate)(p->contents,arg);
          psVar3 = p->next;
          if (bVar1) {
            *ppsVar6 = psVar3;
            sc_mempool::release(p,0x18);
            psVar3 = *ppsVar6;
            this->num_entries = this->num_entries + -1;
            iVar5 = iVar5 + 1;
          }
          else {
            ppsVar6 = &p->next;
          }
          p = psVar3;
        } while (psVar3 != (sc_phash_elem *)0x0);
        iVar2 = this->num_bins;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return iVar5;
}

Assistant:

int
sc_phash_base::remove_by_contents( bool (*predicate)(const void* c, void* arg), void* arg )
{
    sc_phash_elem** last;
    sc_phash_elem*  ptr;

    int num_removed = 0;
    for (int i = 0; i < num_bins; ++i) {
        last = &(bins[i]);
        ptr = *last;
        while (ptr != 0) {
            if (! (*predicate)(ptr->contents, arg)) {
                last = &(ptr->next);
                ptr  = *last;
            }
            else {
                *last = ptr->next;
                delete ptr;
                ptr = *last;
                --num_entries;
                ++num_removed;
            }
        }
    }
    return num_removed;
}